

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::PrimitiveTypeHelper<17>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint32(output,*ptr >> 0x1f ^ *ptr * 2);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteSInt32NoTag(Get<int32>(ptr), output);
  }